

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

TPZVec<double> * __thiscall
TPZAnalysis::Integrate
          (TPZAnalysis *this,string *varname,set<int,_std::less<int>,_std::allocator<int>_> *matids)

{
  TPZMaterial *pTVar1;
  bool bVar2;
  mapped_type_conflict4 mVar3;
  int iVar4;
  pointer ppVar5;
  mapped_type_conflict4 *pmVar6;
  TPZManVector<double,_3> *this_00;
  TPZCompEl *copy;
  TPZGeoEl *this_01;
  const_iterator this_02;
  TPZManVector<double,_3> *rval;
  undefined8 in_RDX;
  long in_RSI;
  TPZVec<double> *in_RDI;
  int iv;
  TPZManVector<double,_3> locres;
  int matid;
  TPZGeoEl *gel;
  TPZCompEl *cel;
  int64_t el;
  int64_t nelem;
  TPZManVector<double,_3> result;
  iterator itmap;
  int nvars;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> variableids;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *in_stack_fffffffffffffd98;
  TPZCompMesh *in_stack_fffffffffffffda0;
  TPZCompEl *in_stack_fffffffffffffda8;
  TPZCompEl *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  TPZManVector<double,_3> *in_stack_fffffffffffffdd0;
  key_type *in_stack_fffffffffffffdd8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffde0;
  int local_1ac;
  undefined1 local_1a8 [88];
  undefined8 local_150;
  TPZVec<double> local_148;
  _Self local_110;
  _Self local_108;
  int local_fc;
  TPZGeoEl *local_f8;
  TPZCompEl *local_f0;
  long local_e8;
  TPZManVector<double,_3> *local_e0;
  undefined8 local_d8;
  TPZVec<double> local_d0;
  _Base_ptr local_98;
  _Self local_90;
  _Self local_88;
  _Self local_80 [3];
  _Base_ptr local_68;
  _Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> local_60;
  int local_54;
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x1c36927
            );
  local_54 = 0;
  std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::_Rb_tree_iterator(&local_60);
  TPZCompMesh::MaterialVec(*(TPZCompMesh **)(in_RSI + 0x10));
  local_68 = (_Base_ptr)
             std::
             map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
             ::begin(in_stack_fffffffffffffd98);
  local_60._M_node = local_68;
  while( true ) {
    TPZCompMesh::MaterialVec(*(TPZCompMesh **)(in_RSI + 0x10));
    local_80[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::end(in_stack_fffffffffffffd98);
    bVar2 = std::operator!=(&local_60,local_80);
    if (!bVar2) break;
    std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)in_stack_fffffffffffffda0)
    ;
    local_88._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd98,
                    (key_type *)0x1c369fa);
    local_90._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd98);
    bVar2 = std::operator!=(&local_88,&local_90);
    if (bVar2) {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                          in_stack_fffffffffffffda0);
      mVar3 = (**(code **)(*(long *)ppVar5->second + 0x80))(ppVar5->second,local_18);
      std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                 in_stack_fffffffffffffda0);
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      *pmVar6 = mVar3;
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                          in_stack_fffffffffffffda0);
      pTVar1 = ppVar5->second;
      std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                 in_stack_fffffffffffffda0);
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      local_54 = (**(code **)(*(long *)pTVar1 + 0x88))(pTVar1,*pmVar6);
    }
    local_98 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator++
                         ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                          in_stack_fffffffffffffda8,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20))
    ;
  }
  local_d8 = 0;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,in_stack_fffffffffffffdc0);
  this_00 = (TPZManVector<double,_3> *)TPZCompMesh::NElements((TPZCompMesh *)0x1c36b7b);
  local_e0 = this_00;
  for (local_e8 = 0; local_e8 < (long)local_e0; local_e8 = local_e8 + 1) {
    copy = TPZCompMesh::Element(in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98);
    local_f0 = copy;
    if ((copy != (TPZCompEl *)0x0) &&
       (this_01 = TPZCompEl::Reference(in_stack_fffffffffffffda8), local_f8 = this_01,
       this_01 != (TPZGeoEl *)0x0)) {
      iVar4 = TPZGeoEl::MaterialId(this_01);
      local_fc = iVar4;
      this_02 = std::set<int,_std::less<int>,_std::allocator<int>_>::find
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffd98,(key_type *)0x1c36c6b);
      local_108._M_node = this_02._M_node;
      local_110._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffd98);
      bVar2 = std::operator==(&local_108,&local_110);
      if (!bVar2) {
        local_150 = 0;
        TPZManVector<double,_3>::TPZManVector
                  ((TPZManVector<double,_3> *)this_01,CONCAT44(iVar4,in_stack_fffffffffffffdc8),
                   (double *)this_02._M_node);
        in_stack_fffffffffffffdb0 = local_f0;
        rval = (TPZManVector<double,_3> *)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)this_00,(key_type *)copy);
        (**(code **)(*(long *)in_stack_fffffffffffffdb0 + 0x1c0))
                  (local_1a8,in_stack_fffffffffffffdb0,
                   *(mapped_type_conflict4 *)&(rval->super_TPZVec<double>)._vptr_TPZVec);
        TPZManVector<double,_3>::TPZManVector(this_00,(TPZVec<double> *)copy);
        TPZManVector<double,_3>::operator=((TPZManVector<double,_3> *)this_02._M_node,rval);
        TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffda0)
        ;
        TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffffda0);
        for (local_1ac = 0; local_1ac < local_54; local_1ac = local_1ac + 1) {
          in_stack_fffffffffffffda8 =
               (TPZCompEl *)TPZVec<double>::operator[](&local_148,(long)local_1ac);
          in_stack_fffffffffffffd98 =
               *(map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                 **)in_stack_fffffffffffffda8;
          in_stack_fffffffffffffda0 =
               (TPZCompMesh *)TPZVec<double>::operator[](&local_d0,(long)local_1ac);
          *(double *)in_stack_fffffffffffffda0 =
               (double)in_stack_fffffffffffffd98 + *(double *)in_stack_fffffffffffffda0;
        }
        TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffda0)
        ;
      }
    }
  }
  TPZVec<double>::TPZVec
            ((TPZVec<double> *)in_stack_fffffffffffffdb0,(TPZVec<double> *)in_stack_fffffffffffffda8
            );
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffda0);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x1c36ebe
            );
  return in_RDI;
}

Assistant:

TPZVec<STATE> TPZAnalysis::Integrate(const std::string &varname, const std::set<int> &matids)
{
    // the postprocessed index of the varname for each material id
    std::map<int,int> variableids;
    int nvars = 0;
    
    std::map<int,TPZMaterial *>::iterator itmap;
    for (itmap = fCompMesh->MaterialVec().begin(); itmap != fCompMesh->MaterialVec().end(); itmap++) {
        if (matids.find(itmap->first) != matids.end()) {
            variableids[itmap->first] = itmap->second->VariableIndex(varname);
            nvars = itmap->second->NSolutionVariables(variableids[itmap->first]);
        }
    }
    TPZManVector<STATE,3> result(nvars,0.);
    int64_t nelem = fCompMesh->NElements();
    for (int64_t el=0; el<nelem; el++) {
        TPZCompEl *cel = fCompMesh->Element(el);
        if (!cel) {
            continue;
        }
        TPZGeoEl *gel = cel->Reference();
        if (!gel) {
            continue;
        }
        int matid = gel->MaterialId();
        if (matids.find(matid) == matids.end()) {
            continue;
        }
        TPZManVector<STATE,3> locres(nvars,0.);
        locres = cel->IntegrateSolution(variableids[matid]);
        for (int iv=0; iv<nvars; iv++)
        {
            result[iv] += locres[iv];
        }
    }
    return result;
}